

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O0

void __thiscall TimeTest_LocalTime_Test::TestBody(TimeTest_LocalTime_Test *this)

{
  bool bVar1;
  tm *ptVar2;
  AssertionResult gtest_ar_;
  tm tm;
  time_t t;
  tm *rhs;
  AssertionResult *this_00;
  char *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  Type in_stack_ffffffffffffff4c;
  AssertHelper *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  AssertionResult *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_58;
  tm local_48;
  time_t *local_10 [2];
  
  local_10[0] = (time_t *)time((time_t *)0x0);
  ptVar2 = localtime((time_t *)local_10);
  local_48.tm_zone = ptVar2->tm_zone;
  local_48.tm_sec = ptVar2->tm_sec;
  local_48.tm_min = ptVar2->tm_min;
  local_48.tm_hour = ptVar2->tm_hour;
  local_48.tm_mday = ptVar2->tm_mday;
  local_48.tm_mon = ptVar2->tm_mon;
  local_48.tm_year = ptVar2->tm_year;
  local_48.tm_wday = ptVar2->tm_wday;
  local_48.tm_yday = ptVar2->tm_yday;
  local_48.tm_isdst = ptVar2->tm_isdst;
  local_48._36_4_ = *(undefined4 *)&ptVar2->field_0x24;
  local_48.tm_gmtoff = ptVar2->tm_gmtoff;
  rhs = (tm *)&stack0xffffffffffffff70;
  fmt::v5::localtime((v5 *)rhs,local_10[0]);
  EqualTime(&local_48,rhs);
  this_00 = &local_58;
  testing::AssertionResult::AssertionResult(this_00,SUB81((ulong)rhs >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffa0,(Message *)in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    testing::Message::~Message((Message *)0x10b2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b315);
  return;
}

Assistant:

TEST(TimeTest, LocalTime) {
  std::time_t t = std::time(FMT_NULL);
  std::tm tm = *std::localtime(&t);
  EXPECT_TRUE(EqualTime(tm, fmt::localtime(t)));
}